

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

size_t MeCab::
       tokenizeCSV<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                 (char *str,
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 out,size_t max)

{
  size_t sVar1;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  ulong in_RDX;
  char *in_RDI;
  bool bVar2;
  size_t n;
  char *end;
  char *start;
  char *eos;
  value_type *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff60;
  allocator *in_stack_ffffffffffffff68;
  uint7 in_stack_ffffffffffffff70;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80 [3];
  allocator local_61;
  string local_60 [38];
  undefined1 local_3a;
  undefined1 local_39;
  size_t local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  ulong local_18;
  char *local_10;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8;
  
  local_18 = in_RDX;
  local_10 = in_RDI;
  sVar1 = strlen(in_RDI);
  local_20 = in_RDI + sVar1;
  local_30 = (char *)0x0;
  local_38 = 0;
  while( true ) {
    if (local_20 <= local_10) {
      return local_38;
    }
    while( true ) {
      bVar2 = true;
      if (*local_10 != ' ') {
        bVar2 = *local_10 == '\t';
      }
      if (!bVar2) break;
      local_10 = local_10 + 1;
    }
    if (*local_10 == '\"') {
      local_28 = local_10 + 1;
      local_30 = local_28;
      for (local_10 = local_28;
          (local_10 < local_20 &&
          ((*local_10 != '\"' || (local_10 = local_10 + 1, *local_10 == '\"'))));
          local_10 = local_10 + 1) {
        *local_30 = *local_10;
        local_30 = local_30 + 1;
      }
      local_39 = 0x2c;
      local_10 = std::find<char*,char>
                           ((char *)(ulong)in_stack_ffffffffffffff70,
                            (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    else {
      local_28 = local_10;
      local_3a = 0x2c;
      local_30 = std::find<char*,char>
                           ((char *)(ulong)in_stack_ffffffffffffff70,
                            (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      local_10 = local_30;
    }
    if (1 < local_18) {
      *local_30 = '\0';
    }
    in_stack_ffffffffffffff68 = &local_61;
    in_stack_ffffffffffffff60 = local_28;
    local_18 = local_18 - 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    local_80[0] = std::
                  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_8,0);
    this = std::
           back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(local_80);
    std::
    back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(this,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_38 = local_38 + 1;
    if (local_18 == 0) break;
    local_10 = local_10 + 1;
  }
  return local_38;
}

Assistant:

inline size_t tokenizeCSV(char *str,
                          Iterator out, size_t max) {
  char *eos = str + std::strlen(str);
  char *start = 0;
  char *end = 0;
  size_t n = 0;

  for (; str < eos; ++str) {
    // skip white spaces
     while (*str == ' ' || *str == '\t') ++str;
    if (*str == '"') {
      start = ++str;
      end = start;
      for (; str < eos; ++str) {
        if (*str == '"') {
          str++;
          if (*str != '"')
            break;
        }
        *end++ = *str;
      }
      str = std::find(str, eos, ',');
    } else {
      start = str;
      str = std::find(str, eos, ',');
      end = str;
    }
    if (max-- > 1) *end = '\0';
    *out++ = start;
    ++n;
    if (max == 0) break;
  }

  return n;
}